

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pf_filehandle.cc
# Opt level: O0

RC __thiscall PF_FileHandle::MarkDirty(PF_FileHandle *this,PageNum pageNum)

{
  int iVar1;
  PageNum pageNum_local;
  PF_FileHandle *this_local;
  
  if (this->bFileOpen == 0) {
    this_local._4_4_ = 5;
  }
  else {
    iVar1 = IsValidPageNum(this,pageNum);
    if (iVar1 == 0) {
      this_local._4_4_ = 3;
    }
    else {
      this_local._4_4_ = PF_BufferMgr::MarkDirty(this->pBufferMgr,this->unixfd,pageNum);
    }
  }
  return this_local._4_4_;
}

Assistant:

RC PF_FileHandle::MarkDirty(PageNum pageNum) const
{
   // File must be open
   if (!bFileOpen)
      return (PF_CLOSEDFILE);

   // Validate page number
   if (!IsValidPageNum(pageNum))
      return (PF_INVALIDPAGE);

   // Tell the buffer manager to mark the page dirty
   return (pBufferMgr->MarkDirty(unixfd, pageNum));
}